

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::check_interface_variable(ValidationState_t *_,Instruction *var)

{
  pointer *this;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppIVar7;
  reference ppVar8;
  reference ppFVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar10;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *this_01;
  reference val;
  reference puVar11;
  DiagnosticStream *pDVar12;
  uint32_t local_3ec;
  DiagnosticStream local_3e8;
  uint32_t local_20c;
  const_iterator cStack_208;
  uint interface;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4_1;
  bool found;
  EntryPointDescription *desc;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *__range3_1;
  iterator iStack_1c0;
  uint id_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1a0;
  const_iterator local_198;
  uint *local_190;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_188;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_180;
  const_iterator local_178;
  uint *local_170;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_168;
  uint local_15c;
  const_iterator cStack_158;
  uint id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  Function *func_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
  *__range2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> entry_points;
  __normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
  local_100;
  const_iterator local_f8;
  Function **local_f0;
  __normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
  local_e8;
  __normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
  local_e0;
  const_iterator local_d8;
  Function **local_c8;
  Function **local_c0;
  Instruction *local_b8;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> use_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range4;
  Function *func;
  value_type user;
  Instruction *pIStack_78;
  uint32_t i;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> use;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range2;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  uses;
  vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
  functions;
  Instruction *var_local;
  ValidationState_t *__local;
  
  std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>::
  vector((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
          *)&uses.
             super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>::
  vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
          *)&__range2);
  pvVar4 = val::Instruction::uses(var);
  __end2 = std::
           vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
           ::begin(pvVar4);
  use._8_8_ = std::
              vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                     *)&use.second), bVar1) {
    ppVar8 = __gnu_cxx::
             __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
             ::operator*(&__end2);
    pIStack_78 = ppVar8->first;
    use.first = *(Instruction **)&ppVar8->second;
    std::
    vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 *)&__range2,&stack0xffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
    ::operator++(&__end2);
  }
  for (user._4_4_ = 0; uVar5 = (ulong)user._4_4_,
      sVar6 = std::
              vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
              ::size((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                      *)&__range2), uVar5 < sVar6; user._4_4_ = user._4_4_ + 1) {
    ppIVar7 = std::
              vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
              ::operator[]((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                            *)&__range2,(ulong)user._4_4_);
    func = (Function *)*ppIVar7;
    __range4 = (vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                *)val::Instruction::function((Instruction *)func);
    if ((Function *)__range4 == (Function *)0x0) {
      pvVar4 = val::Instruction::uses((Instruction *)func);
      __end4 = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ::begin(pvVar4);
      use_1._8_8_ = std::
                    vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ::end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                         *)&use_1.second), bVar1) {
        ppVar8 = __gnu_cxx::
                 __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                 ::operator*(&__end4);
        local_b8 = ppVar8->first;
        use_1.first = *(Instruction **)&ppVar8->second;
        std::
        vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
        ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                     *)&__range2,&local_b8);
        __gnu_cxx::
        __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
        ::operator++(&__end4);
      }
    }
    else {
      std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
      ::push_back((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                   *)&uses.
                      super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range4);
    }
  }
  local_c0 = (Function **)
             std::
             vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
             ::begin((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                      *)&uses.
                         super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c8 = (Function **)
             std::
             vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
             ::end((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                    *)&uses.
                       super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  sort<__gnu_cxx::__normal_iterator<spvtools::val::Function_const**,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>,spvtools::val::(anonymous_namespace)::check_interface_variable(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0>
            (local_c0,local_c8);
  local_e8._M_current =
       (Function **)
       std::
       vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>::
       begin((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
              *)&uses.
                 super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_f0 = (Function **)
             std::
             vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
             ::end((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                    *)&uses.
                       super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_e0 = std::
             unique<__gnu_cxx::__normal_iterator<spvtools::val::Function_const**,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>>
                       (local_e8,(__normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
                                  )local_f0);
  __gnu_cxx::
  __normal_iterator<spvtools::val::Function_const*const*,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>
  ::__normal_iterator<spvtools::val::Function_const**>
            ((__normal_iterator<spvtools::val::Function_const*const*,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>
              *)&local_d8,&local_e0);
  local_100._M_current =
       (Function **)
       std::
       vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>::
       end((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
            *)&uses.
               super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<spvtools::val::Function_const*const*,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>
  ::__normal_iterator<spvtools::val::Function_const**>
            ((__normal_iterator<spvtools::val::Function_const*const*,std::vector<spvtools::val::Function_const*,std::allocator<spvtools::val::Function_const*>>>
              *)&local_f8,&local_100);
  entry_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                ::erase((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                         *)&uses.
                            super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d8,local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  this = &uses.
          super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = std::
             vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
             ::begin((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                      *)this);
  func_1 = (Function *)
           std::
           vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
           ::end((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                  *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
                             *)&func_1), bVar1) {
    ppFVar9 = __gnu_cxx::
              __normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
              ::operator*(&__end2_1);
    uVar3 = val::Function::id(*ppFVar9);
    this_00 = ValidationState_t::FunctionEntryPoints(_,uVar3);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    cStack_158 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffea8), bVar1) {
      puVar11 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end3);
      local_15c = *puVar11;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1,&local_15c);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Function_**,_std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>_>
    ::operator++(&__end2_1);
  }
  local_168._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  local_170 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_168,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_170);
  local_188._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  local_190 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1)
  ;
  local_180 = std::
              unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (local_188,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_190);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_178,&local_180);
  local_1a0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_198,&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1,local_178,local_198)
  ;
  __end2_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  iStack_1c0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffe40);
    if (!bVar1) {
      __local._4_4_ = SPV_SUCCESS;
LAB_00b3eba2:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
      std::
      vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
      ::~vector((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 *)&__range2);
      std::vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
      ::~vector((vector<const_spvtools::val::Function_*,_std::allocator<const_spvtools::val::Function_*>_>
                 *)&uses.
                    super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __local._4_4_;
    }
    puVar10 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&__end2_2);
    __range3_1._4_4_ = *puVar10;
    this_01 = ValidationState_t::entry_point_descriptions(_,__range3_1._4_4_);
    __end3_1 = std::
               vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
               ::begin(this_01);
    desc = (EntryPointDescription *)
           std::
           vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                               *)&desc), bVar1) {
      val = __gnu_cxx::
            __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
            ::operator*(&__end3_1);
      bVar1 = false;
      __end4_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&val->interfaces);
      cStack_208 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&val->interfaces);
      while (bVar2 = __gnu_cxx::operator!=(&__end4_1,&stack0xfffffffffffffdf8), bVar2) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end4_1);
        local_20c = *puVar11;
        uVar3 = val::Instruction::id(var);
        if (uVar3 == local_20c) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4_1);
      }
      if (!bVar1) {
        ValidationState_t::diag(&local_3e8,_,SPV_ERROR_INVALID_ID,var);
        pDVar12 = DiagnosticStream::operator<<(&local_3e8,(char (*) [24])"Interface variable id <");
        local_3ec = val::Instruction::id(var);
        pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_3ec);
        pDVar12 = DiagnosticStream::operator<<(pDVar12,(char (*) [27])"> is used by entry point \'")
        ;
        pDVar12 = DiagnosticStream::operator<<(pDVar12,&val->name);
        pDVar12 = DiagnosticStream::operator<<(pDVar12,(char (*) [7])"\' id <");
        pDVar12 = DiagnosticStream::operator<<(pDVar12,(uint *)((long)&__range3_1 + 4));
        pDVar12 = DiagnosticStream::operator<<
                            (pDVar12,(char (*) [37])">, but is not listed as an interface");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
        goto LAB_00b3eba2;
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
      ::operator++(&__end3_1);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2_2);
  } while( true );
}

Assistant:

spv_result_t check_interface_variable(ValidationState_t& _,
                                      const Instruction* var) {
  std::vector<const Function*> functions;
  std::vector<const Instruction*> uses;
  for (auto use : var->uses()) {
    uses.push_back(use.first);
  }
  for (uint32_t i = 0; i < uses.size(); ++i) {
    const auto user = uses[i];
    if (const Function* func = user->function()) {
      functions.push_back(func);
    } else {
      // In the rare case that the variable is used by another instruction in
      // the global scope, continue searching for an instruction used in a
      // function.
      for (auto use : user->uses()) {
        uses.push_back(use.first);
      }
    }
  }

  std::sort(functions.begin(), functions.end(),
            [](const Function* lhs, const Function* rhs) {
              return lhs->id() < rhs->id();
            });
  functions.erase(std::unique(functions.begin(), functions.end()),
                  functions.end());

  std::vector<uint32_t> entry_points;
  for (const auto func : functions) {
    for (auto id : _.FunctionEntryPoints(func->id())) {
      entry_points.push_back(id);
    }
  }

  std::sort(entry_points.begin(), entry_points.end());
  entry_points.erase(std::unique(entry_points.begin(), entry_points.end()),
                     entry_points.end());

  for (auto id : entry_points) {
    for (const auto& desc : _.entry_point_descriptions(id)) {
      bool found = false;
      for (auto interface : desc.interfaces) {
        if (var->id() == interface) {
          found = true;
          break;
        }
      }
      if (!found) {
        return _.diag(SPV_ERROR_INVALID_ID, var)
               << "Interface variable id <" << var->id()
               << "> is used by entry point '" << desc.name << "' id <" << id
               << ">, but is not listed as an interface";
      }
    }
  }

  return SPV_SUCCESS;
}